

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_getAbsolutePath
          (CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ushort uVar1;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong uVar8;
  char *buf;
  size_t sVar9;
  char *buf_00;
  undefined4 in_register_00000034;
  size_t sVar10;
  long lVar11;
  char *pcVar12;
  err_frame_t err_cur__;
  
  if (oargc == (uint *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = (long)(int)*oargc;
  }
  if ((getp_getAbsolutePath(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar4 = __cxa_guard_acquire(&getp_getAbsolutePath(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                  CONCAT44(in_register_00000034,self)), iVar4 != 0)) {
    getp_getAbsolutePath::desc.min_argc_ = 0;
    getp_getAbsolutePath::desc.opt_argc_ = 0;
    getp_getAbsolutePath::desc.varargs_ = 0;
    __cxa_guard_release(&getp_getAbsolutePath(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getAbsolutePath::desc);
  if (iVar4 == 0) {
    pcVar12 = (this->super_CVmObject).ext_;
    uVar1 = *(ushort *)(pcVar12 + 6);
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar6;
    plVar7 = (long *)_ZTW11G_err_frame();
    *plVar7 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      pcVar12 = pcVar12 + 8;
      iVar4 = fn_is_file_absolute(pcVar12);
      if (iVar4 == 0) {
        sVar9 = strlen(G_file_path_X);
        uVar8 = sVar9 + uVar1 + 0x20;
        sVar10 = 0x1000;
        if (0x1000 < uVar8) {
          sVar10 = uVar8;
        }
        buf = lib_alloc_str(sVar10);
        fn_build_full_path(buf,sVar10,G_file_path_X,pcVar12,1);
        pcVar12 = buf;
      }
      else {
        buf = (char *)0x0;
      }
      sVar9 = strlen(pcVar12);
      sVar10 = 0x1000;
      if (0x1000 < sVar9 + 0x20) {
        sVar10 = sVar9 + 0x20;
      }
      buf_00 = lib_alloc_str(sVar10);
      iVar4 = CVmNetFile::is_net_mode();
      if ((iVar4 == 0) && (iVar4 = os_get_abs_filename(buf_00,sVar10,pcVar12), iVar4 != 0)) {
        sVar9 = strlen(buf_00);
        vVar5 = CVmObjString::create(0,buf_00,sVar9);
        retval->typ = VM_OBJ;
        (retval->val).obj = vVar5;
      }
      else {
        retval->typ = VM_NIL;
      }
    }
    else {
      buf_00 = (char *)0x0;
      buf = buf_00;
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      lib_free_str(buf);
      lib_free_str(buf_00);
    }
    peVar2 = err_cur__.prv_;
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    *puVar6 = peVar2;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar6 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar6 & 2) != 0) {
        plVar7 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar7 + 0x10));
      }
      pCVar3 = err_cur__.exc_;
      plVar7 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar7 + 0x10) = pCVar3;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -lVar11;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getAbsolutePath(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get our local filename string */
    const char *fname = get_ext()->get_str();
    size_t fnamel = get_ext()->get_len();

    /* we haven't allocated any strings yet */
    char *buf = 0, *outbuf = 0;

    err_try
    {
        /* 
         *   if it's not absolute already, combine it with our internal
         *   working directory to get the fully qualified path
         */
        const char *src = fname;
        if (!fn_is_file_absolute(vmg_ fname))
        {
            /* allocate space for the combined path */
            size_t buflen = fnamel + strlen(G_file_path) + 32;
            if (buflen < OSFNMAX)
                buflen = OSFNMAX;

            /* build the combined path */
            buf = lib_alloc_str(buflen);
            fn_build_full_path(vmg_ buf, buflen, G_file_path, fname, TRUE);

            /* use this as the new source path */
            src = buf;
        }

        /* 
         *   Even though the name should already be absolute, run it through
         *   os_get_abs_filename() anyway, since that will convert the name
         *   to a more canonical format on many systems. 
         */

        /* figure how much space we'll need, adding some padding */
        size_t buflen = strlen(src) + 32;
        if (buflen < OSFNMAX)
            buflen = OSFNMAX;

        /* allocate the buffer and do the conversion */
        outbuf = lib_alloc_str(buflen);
        if (fn_get_abs_filename(vmg_ outbuf, buflen, src))
        {
            /* success - return the result string */
            retval->set_obj(CVmObjString::create(
                vmg_ FALSE, outbuf, strlen(outbuf)));
        }
        else
        {
            /* failure - return nil */
            retval->set_nil();
        }
    }